

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<prometheus::MetricType> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<prometheus::MetricType> PVar1;
  _Vector_base<prometheus::MetricType,_std::allocator<prometheus::MetricType>_> _Stack_28;
  
  ValueArray<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>
  ::MakeVector<prometheus::MetricType,0ul,1ul,2ul,3ul,4ul,5ul>(&_Stack_28);
  ValuesIn<std::vector<prometheus::MetricType,std::allocator<prometheus::MetricType>>>
            ((testing *)this,
             (vector<prometheus::MetricType,_std::allocator<prometheus::MetricType>_> *)&_Stack_28);
  std::_Vector_base<prometheus::MetricType,_std::allocator<prometheus::MetricType>_>::~_Vector_base
            (&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<prometheus::MetricType>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<prometheus::MetricType>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }